

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::PrintSummary(LpSolver *this)

{
  ostream *poVar1;
  Int status;
  Int status_00;
  string *psVar2;
  char *pcVar3;
  double d;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream h_logging_stream;
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&h_logging_stream);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_190 + 8));
  std::__cxx11::string::~string((string *)&local_300);
  std::operator<<((ostream *)local_190,"Summary\n");
  if ((this->control_).parameters_.super_ipx_parameters.timeless_log == false) {
    Textline<char[9]>(&local_300,(char (*) [9])"Runtime:");
    psVar2 = &local_300;
    poVar1 = std::operator<<((ostream *)local_190,(string *)psVar2);
    d = Control::Elapsed(&this->control_);
    fix2_abi_cxx11_(&local_2e0,(ipx *)psVar2,d);
    poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
    std::operator<<(poVar1,"s\n");
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
  }
  Textline<char[29]>(&local_300,(char (*) [29])"Status interior point solve:");
  poVar1 = std::operator<<((ostream *)local_190,(string *)&local_300);
  StatusString_abi_cxx11_
            (&local_2e0,(ipx *)(ulong)(uint)(this->info_).super_ipx_info.status_ipm,status);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
  poVar1 = std::operator<<(poVar1,'\n');
  Textline<char[18]>(&local_2a0,(char (*) [18])"Status crossover:");
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  StatusString_abi_cxx11_
            (&local_2c0,(ipx *)(ulong)(uint)(this->info_).super_ipx_info.status_crossover,status_00)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  Control::hLog(&this->control_,&h_logging_stream);
  if ((this->info_).super_ipx_info.status_ipm - 1U < 2) {
    Textline<char[17]>(&local_300,(char (*) [17])"objective value:");
    psVar2 = &local_300;
    poVar1 = std::operator<<((ostream *)local_190,(string *)psVar2);
    sci8_abi_cxx11_(&local_2e0,(ipx *)psVar2,(this->info_).super_ipx_info.pobjval);
    poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
    poVar1 = std::operator<<(poVar1,'\n');
    Textline<char[45]>(&local_2a0,(char (*) [45])"interior solution primal residual (abs/rel):");
    psVar2 = &local_2a0;
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    sci2_abi_cxx11_(&local_2c0,(ipx *)psVar2,(this->info_).super_ipx_info.abs_presidual);
    poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
    pcVar3 = " / ";
    poVar1 = std::operator<<(poVar1," / ");
    sci2_abi_cxx11_(&local_1c0,(ipx *)pcVar3,(this->info_).super_ipx_info.rel_presidual);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    poVar1 = std::operator<<(poVar1,'\n');
    Textline<char[43]>(&local_1e0,(char (*) [43])"interior solution dual residual (abs/rel):");
    psVar2 = &local_1e0;
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    sci2_abi_cxx11_(&local_200,(ipx *)psVar2,(this->info_).super_ipx_info.abs_dresidual);
    poVar1 = std::operator<<(poVar1,(string *)&local_200);
    pcVar3 = " / ";
    poVar1 = std::operator<<(poVar1," / ");
    sci2_abi_cxx11_(&local_220,(ipx *)pcVar3,(this->info_).super_ipx_info.rel_dresidual);
    poVar1 = std::operator<<(poVar1,(string *)&local_220);
    poVar1 = std::operator<<(poVar1,'\n');
    Textline<char[43]>(&local_240,(char (*) [43])"interior solution objective gap (abs/rel):");
    psVar2 = &local_240;
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    sci2_abi_cxx11_(&local_260,(ipx *)psVar2,
                    (this->info_).super_ipx_info.pobjval - (this->info_).super_ipx_info.dobjval);
    poVar1 = std::operator<<(poVar1,(string *)&local_260);
    pcVar3 = " / ";
    poVar1 = std::operator<<(poVar1," / ");
    sci2_abi_cxx11_(&local_280,(ipx *)pcVar3,(this->info_).super_ipx_info.rel_objgap);
    poVar1 = std::operator<<(poVar1,(string *)&local_280);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    Control::hLog(&this->control_,&h_logging_stream);
  }
  if ((this->info_).super_ipx_info.status_crossover - 1U < 2) {
    Textline<char[37]>(&local_300,(char (*) [37])"basic solution primal infeasibility:");
    psVar2 = &local_300;
    poVar1 = std::operator<<((ostream *)local_190,(string *)psVar2);
    sci2_abi_cxx11_(&local_2e0,(ipx *)psVar2,(this->info_).super_ipx_info.primal_infeas);
    poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
    poVar1 = std::operator<<(poVar1,'\n');
    Textline<char[35]>(&local_2a0,(char (*) [35])"basic solution dual infeasibility:");
    psVar2 = &local_2a0;
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    sci2_abi_cxx11_(&local_2c0,(ipx *)psVar2,(this->info_).super_ipx_info.dual_infeas);
    poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    Control::hLog(&this->control_,&h_logging_stream);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&h_logging_stream);
  return;
}

Assistant:

void LpSolver::PrintSummary() {
  std::stringstream h_logging_stream;
  h_logging_stream.str(std::string());
  h_logging_stream << "Summary\n";
  if (!control_.timelessLog())
    h_logging_stream << Textline("Runtime:") << fix2(control_.Elapsed()) << "s\n";
  h_logging_stream << Textline("Status interior point solve:")
                   << StatusString(info_.status_ipm) << '\n'
                   << Textline("Status crossover:")
                   << StatusString(info_.status_crossover) << '\n';
  control_.hLog(h_logging_stream);
  if (info_.status_ipm == IPX_STATUS_optimal ||
      info_.status_ipm == IPX_STATUS_imprecise) {
    h_logging_stream
      << Textline("objective value:") << sci8(info_.pobjval) << '\n'
      << Textline("interior solution primal residual (abs/rel):")
      << sci2(info_.abs_presidual) << " / " << sci2(info_.rel_presidual)
      << '\n'
      << Textline("interior solution dual residual (abs/rel):")
      << sci2(info_.abs_dresidual) << " / " << sci2(info_.rel_dresidual)
      << '\n'
      << Textline("interior solution objective gap (abs/rel):")
      << sci2(info_.pobjval-info_.dobjval) << " / "
      << sci2(info_.rel_objgap)  << '\n';
    control_.hLog(h_logging_stream);
  }
  if (info_.status_crossover == IPX_STATUS_optimal ||
      info_.status_crossover == IPX_STATUS_imprecise) {
    h_logging_stream
      << Textline("basic solution primal infeasibility:")
      << sci2(info_.primal_infeas) << '\n'
      << Textline("basic solution dual infeasibility:")
      << sci2(info_.dual_infeas) << '\n';
    control_.hLog(h_logging_stream);
  }
}